

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_json.c
# Opt level: O3

void json_add_bool(json_t *json,char *key,_Bool bvalue)

{
  size_t len;
  char *buffer;
  undefined1 in_R8B;
  
  json_check_comma(json);
  if (key != (char *)0x0) {
    len = strlen(key);
    json_write_raw(json,key,len,true,(_Bool)in_R8B);
    json_write_raw(json,":",1,false,(_Bool)in_R8B);
  }
  buffer = "false";
  if (bvalue) {
    buffer = "true";
  }
  json_write_raw(json,buffer,(ulong)bvalue ^ 5,false,(_Bool)in_R8B);
  return;
}

Assistant:

void json_add_bool (json_t *json, const char *key, bool bvalue) {
    json_check_comma(json);
    
    const char *value = (bvalue) ? "true" : "false";

    if (key) {
        json_write_raw (json, key, strlen(key), true, true);
        JSON_WRITE_COLUMN;
    }
    
    json_write_raw(json, value, strlen(value), false, (key == NULL));
}